

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::AddString
          (Reflection *this,Message *message,FieldDescriptor *field,string *value)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int iVar4;
  Type TVar5;
  Descriptor *pDVar6;
  ExtensionSet *pEVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  string *in_RCX;
  FieldDescriptor *in_RDX;
  long *in_RDI;
  char *in_stack_00000008;
  char *in_stack_00000010;
  undefined4 in_stack_00000018;
  CppType in_stack_0000001c;
  Descriptor *in_stack_00000020;
  FieldDescriptor *in_stack_00000028;
  Descriptor *in_stack_00000030;
  FieldDescriptor *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Message *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  string local_40 [40];
  FieldDescriptor *local_18;
  
  local_18 = in_RDX;
  pDVar6 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar6 != (Descriptor *)*in_RDI) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000020,(FieldDescriptor *)CONCAT44(in_stack_0000001c,in_stack_00000018),
               in_stack_00000010,in_stack_00000008);
  }
  LVar2 = FieldDescriptor::label(local_18);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000020,(FieldDescriptor *)CONCAT44(in_stack_0000001c,in_stack_00000018),
               in_stack_00000010,in_stack_00000008);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x419b9d);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (in_stack_00000030,in_stack_00000028,(char *)in_stack_00000020,in_stack_0000001c);
  }
  bVar1 = FieldDescriptor::is_extension(local_18);
  if (bVar1) {
    pEVar7 = MutableExtensionSet((Reflection *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                 (Message *)in_stack_ffffffffffffff78);
    iVar4 = FieldDescriptor::number(local_18);
    TVar5 = FieldDescriptor::type((FieldDescriptor *)CONCAT44(iVar4,in_stack_ffffffffffffff90));
    std::__cxx11::string::string(local_40,in_RCX);
    internal::ExtensionSet::AddString
              ((ExtensionSet *)CONCAT44(iVar4,in_stack_ffffffffffffff90),
               (int)((ulong)pEVar7 >> 0x20),(FieldType)((ulong)pEVar7 >> 0x18),
               (string *)CONCAT44(TVar5,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    std::__cxx11::string::~string(local_40);
  }
  else {
    FieldDescriptor::options(local_18);
    FieldOptions::ctype((FieldOptions *)0x419c70);
    pbVar8 = AddField<std::__cxx11::string>
                       ((Reflection *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88,
                        (FieldDescriptor *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    std::__cxx11::string::assign((string *)pbVar8);
  }
  return;
}

Assistant:

void Reflection::AddString(Message* message, const FieldDescriptor* field,
                           std::string value) const {
  USAGE_CHECK_ALL(AddString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddString(field->number(), field->type(),
                                            std::move(value), field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        AddField<std::string>(message, field)->assign(std::move(value));
        break;
    }
  }
}